

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack27_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x8000000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 5;
  *puVar1 = (in[2] - base) * 0x400000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] - base >> 10;
  *puVar1 = (in[3] - base) * 0x20000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3] - base >> 0xf;
  *puVar1 = (in[4] - base) * 0x1000 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[4] - base >> 0x14;
  *puVar1 = (in[5] - base) * 0x80 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[5] - base >> 0x19;
  *puVar1 = (in[6] - base) * 4 | *puVar1;
  *puVar1 = (in[7] - base) * 0x20000000 | *puVar1;
  out[6] = in[7] - base >> 3;
  return out + 7;
}

Assistant:

uint32_t * pack27_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  22 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  17 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  7 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  24 );
    ++in;

    return out + 1;
}